

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Vec_Ptr_t * Saig_ManCollectedDiffNodes(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iVar4;
  
  Aig_ManIncrementTravId(p0);
  p = Vec_PtrAlloc(1000);
  iVar4 = 0;
  do {
    if (p0->vObjs->nSize <= iVar4) {
      iVar4 = 0;
      do {
        if (p0->nRegs <= iVar4) {
          return p;
        }
        pAVar1 = Saig_ManLi(p0,iVar4);
        pAVar2 = Saig_ManLo(p0,iVar4);
        iVar4 = iVar4 + 1;
      } while ((pAVar2->TravId != p0->nTravIds) != (pAVar1->TravId == p0->nTravIds));
      __assert_fail("Aig_ObjIsTravIdCurrent(p0, pObj0) == Aig_ObjIsTravIdCurrent(p0, pObj1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigWnd.c"
                    ,0x240,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
    }
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,iVar4);
    if (pAVar1 != (Aig_Obj_t *)0x0) {
      if ((p0->pReprs == (Aig_Obj_t **)0x0) ||
         (pAVar2 = p0->pReprs[pAVar1->Id], pAVar2 == (Aig_Obj_t *)0x0)) {
        pAVar1->TravId = p0->nTravIds;
        uVar3 = *(uint *)&pAVar1->field_0x18 & 7;
        if ((uVar3 == 2) || (uVar3 - 5 < 2)) {
          Vec_PtrPush(p,pAVar1);
        }
      }
      else if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar1 != p1->pReprs[pAVar2->Id])) {
        __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigWnd.c"
                      ,0x235,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Saig_ManCollectedDiffNodes( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // collect nodes that are not linked
    Aig_ManIncrementTravId( p0 );
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 != NULL )
        {
            assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );   
            continue;
        }
        // mark and collect unmatched objects
        Aig_ObjSetTravIdCurrent( p0, pObj0 ); 
        if ( Aig_ObjIsNode(pObj0) || Aig_ObjIsCi(pObj0) )
            Vec_PtrPush( vNodes, pObj0 );
    }
    // make sure LI/LO are labeled/unlabeled mutually
    Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
        assert( Aig_ObjIsTravIdCurrent(p0, pObj0) == 
                Aig_ObjIsTravIdCurrent(p0, pObj1) );
    return vNodes;
}